

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall
gmath::OrthoCamera::reconstructPoint(OrthoCamera *this,Vector3d *Pw,Vector2d *p,double d)

{
  InvalidArgumentException *this_00;
  Vector3d Pc;
  SVector<double,_3> local_58;
  SVector<double,_3> local_40;
  
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    SVector<double,_3>::SVector(&Pc);
    Pc.v[0] = this->res * *(double *)p;
    Pc.v[1] = this->res * -*(double *)(p + 8);
    Pc.v[2] = d * this->dres;
    SMatrix<double,_3,_3>::operator*(&local_40,&(this->super_Camera).R,&Pc);
    SVector<double,_3>::operator+(&local_58,&local_40,&(this->super_Camera).T);
    SVector<double,_3>::operator=(Pw,&local_58);
    return;
  }
  this_00 = (InvalidArgumentException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&Pc,"Cannot reconstruct invalid point",(allocator *)&local_58);
  gutil::InvalidArgumentException::InvalidArgumentException(this_00,(string *)&Pc);
  __cxa_throw(this_00,&gutil::InvalidArgumentException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void OrthoCamera::reconstructPoint(Vector3d &Pw, const Vector2d &p, double d)
const
{
  if (!std::isfinite(d))
  {
    throw gutil::InvalidArgumentException("Cannot reconstruct invalid point");
  }

  Vector3d Pc;

  Pc[0]=p[0]*res;
  Pc[1]=-p[1]*res;
  Pc[2]=d*dres;

  Pw=getR()*Pc+getT();
}